

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# note.c
# Opt level: O0

int nsync::note_dequeue(void *v,nsync_waiter_s *nw)

{
  uint uVar1;
  int iVar2;
  nsync_dll_list_ pnVar3;
  nsync_time *local_78;
  nsync_time *local_70;
  nsync_time ntime;
  nsync_note n;
  int was_queued;
  nsync_waiter_s *nw_local;
  void *v_local;
  
  nsync_note_notified_deadline_((nsync_note)v);
  nsync_mu_lock((nsync_mu *)((long)v + 0x30));
  uVar1 = std::atomic_load_explicit<unsigned_int>
                    ((atomic<unsigned_int> *)((long)v + 0x54),memory_order_acquire);
  if (uVar1 == 0) {
    if (*(int *)((long)v + 0x18) == 0) {
      local_78 = (nsync_time *)&nsync_time_no_deadline;
    }
    else {
      local_78 = (nsync_time *)((long)v + 0x20);
    }
    local_70 = local_78;
  }
  else {
    local_70 = (nsync_time *)&nsync_time_zero;
  }
  iVar2 = nsync_time_cmp(*local_70,(nsync_time)ZEXT816(0));
  if (0 < iVar2) {
    pnVar3 = nsync_dll_remove_(*(nsync_dll_list_ *)((long)v + 0x68),&nw->q);
    *(nsync_dll_list_ *)((long)v + 0x68) = pnVar3;
    std::atomic_store_explicit<unsigned_int>(&nw->waiting,0,memory_order_relaxed);
  }
  n._4_4_ = (uint)(0 < iVar2);
  nsync_mu_unlock((nsync_mu *)((long)v + 0x30));
  return n._4_4_;
}

Assistant:

static int note_dequeue (void *v, struct nsync_waiter_s *nw) {
	int was_queued = 0;
	nsync_note n = (nsync_note) v;
	nsync_time ntime;
	nsync_note_notified_deadline_ (n);
	nsync_mu_lock (&n->note_mu);
	ntime = NOTIFIED_TIME (n);
	if (nsync_time_cmp (ntime, nsync_time_zero) > 0) {
		n->waiters = nsync_dll_remove_ (n->waiters, &nw->q);
		ATM_STORE (&nw->waiting, 0);
		was_queued = 1;
	}
	nsync_mu_unlock (&n->note_mu);
	return (was_queued);
}